

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O3

void __thiscall UnifiedRegex::RegexPattern::Print(RegexPattern *this,DebugWriter *w)

{
  Char c;
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  undefined4 *puVar4;
  ThreadConfiguration *pTVar5;
  ulong uVar6;
  ulong uVar7;
  char16_t *form;
  uint uVar8;
  uint uVar9;
  undefined1 local_40 [8];
  InternalString str;
  
  DebugWriter::Print(w,L"/");
  Js::InternalString::InternalString
            ((InternalString *)local_40,(char16 *)**(undefined8 **)&this->rep,
             *(charcount_t *)(*(undefined8 **)&this->rep + 1),'\0');
  uVar9 = local_40._0_4_;
  if (local_40._0_4_ == 0) {
    DebugWriter::Print(w,L"(?:)");
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar7 = 0;
    do {
      uVar6 = (ulong)local_40[4];
      uVar8 = (uint)uVar7;
      c = *(Char *)(str._0_8_ + uVar6 * 2 + uVar7 * 2);
      if ((ushort)c < 0x2f) {
        if (((c == L'\n') || (c == L'\r')) || (c != L'-')) {
LAB_00edf26d:
          DebugWriter::PrintEscapedChar(w,c);
        }
        else {
          DebugWriter::Print(w,L"-");
        }
      }
      else {
        if ((ushort)c - 0x2028 < 2) goto LAB_00edf26d;
        if (c == L'\\') {
          uVar8 = uVar8 + 1;
          if (uVar9 <= uVar8) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                               ,0xbe,"(i + 1 < str.GetLength())","i + 1 < str.GetLength()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar4 = 0;
            uVar6 = (ulong)local_40[4];
          }
          uVar7 = (ulong)*(ushort *)(str._0_8_ + uVar6 * 2 + (ulong)uVar8 * 2);
        }
        else {
          if (c != L'/') goto LAB_00edf26d;
          uVar7 = 0x2f;
        }
        DebugWriter::Print(w,L"\\%lc",uVar7);
      }
      uVar7 = (ulong)(uVar8 + 1);
      uVar9 = local_40._0_4_;
    } while (uVar8 + 1 < (uint)local_40._0_4_);
  }
  DebugWriter::Print(w,L"/");
  TVar3 = ((this->rep).unified.program.ptr)->flags;
  if ((TVar3 & IgnoreCaseRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"i");
    TVar3 = ((this->rep).unified.program.ptr)->flags;
  }
  if ((TVar3 & GlobalRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"g");
    TVar3 = ((this->rep).unified.program.ptr)->flags;
  }
  if ((TVar3 & MultilineRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"m");
  }
  pTVar5 = (((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
           threadConfig;
  if ((pTVar5->m_ES2018RegExDotAll == true) &&
     ((((this->rep).unified.program.ptr)->flags & DotAllRegexFlag) != NoRegexFlags)) {
    DebugWriter::Print(w,L"s");
    pTVar5 = (((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
             threadConfig;
  }
  if ((pTVar5->m_ES6Unicode == true) &&
     ((((this->rep).unified.program.ptr)->flags & UnicodeRegexFlag) != NoRegexFlags)) {
    DebugWriter::Print(w,L"u");
    pTVar5 = (((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
             threadConfig;
  }
  if ((pTVar5->m_ES6RegExSticky == true) &&
     ((((this->rep).unified.program.ptr)->flags & StickyRegexFlag) != NoRegexFlags)) {
    DebugWriter::Print(w,L"y");
  }
  DebugWriter::Print(w,L" /* ");
  DebugWriter::Print(w,L", ");
  form = L"dynamic";
  if ((this->field_0x18 & 1) != 0) {
    form = L"literal";
  }
  DebugWriter::Print(w,form);
  DebugWriter::Print(w,L" */");
  return;
}

Assistant:

void RegexPattern::Print(DebugWriter* w)
    {
        w->Print(_u("/"));

        Js::InternalString str = GetSource();
        if (str.GetLength() == 0)
            w->Print(_u("(?:)"));
        else
        {
            for (charcount_t i = 0; i < str.GetLength(); ++i)
            {
                const char16 c = str.GetBuffer()[i];
                switch(c)
                {
                case _u('/'):
                    w->Print(_u("\\%lc"), c);
                    break;
                case _u('\n'):
                case _u('\r'):
                case _u('\x2028'):
                case _u('\x2029'):
                    w->PrintEscapedChar(c);
                    break;
                case _u('-'):
                    w->Print(_u("-"));
                    break;
                case _u('\\'):
                    Assert(i + 1 < str.GetLength()); // cannot end in a '\'
                    w->Print(_u("\\%lc"), str.GetBuffer()[++i]);
                    break;
                default:
                    w->PrintEscapedChar(c);
                    break;
                }
            }
        }
        w->Print(_u("/"));
        if (IsIgnoreCase())
            w->Print(_u("i"));
        if (IsGlobal())
            w->Print(_u("g"));
        if (IsMultiline())
            w->Print(_u("m"));
        if (IsDotAll())
            w->Print(_u("s"));
        if (IsUnicode())
            w->Print(_u("u"));
        if (IsSticky())
            w->Print(_u("y"));
        w->Print(_u(" /* "));
        w->Print(_u(", "));
        w->Print(isLiteral ? _u("literal") : _u("dynamic"));
        w->Print(_u(" */"));
    }